

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

void __thiscall
deqp::gls::anon_unknown_1::IterationLogSectionEmitter::IterationLogSectionEmitter
          (IterationLogSectionEmitter *this,TestLog *log,size_t testIteration,size_t testIterations,
          string *description,bool enabled)

{
  TestLog *this_00;
  ostream *poVar1;
  undefined3 in_register_00000089;
  ostringstream buf;
  string local_220;
  string local_200;
  LogSection local_1e0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  this->m_log = log;
  this->m_enabled = enabled;
  if (CONCAT31(in_register_00000089,enabled) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Iteration ",10);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    if (description->_M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," - ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,(description->_M_dataplus)._M_p,description->_M_string_length)
      ;
    }
    this_00 = this->m_log;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    tcu::LogSection::LogSection(&local_1e0,&local_200,&local_220);
    tcu::TestLog::startSection
              (this_00,local_1e0.m_name._M_dataplus._M_p,local_1e0.m_description._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_description._M_dataplus._M_p != &local_1e0.m_description.field_2) {
      operator_delete(local_1e0.m_description._M_dataplus._M_p,
                      local_1e0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_name._M_dataplus._M_p != &local_1e0.m_name.field_2) {
      operator_delete(local_1e0.m_name._M_dataplus._M_p,
                      local_1e0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

IterationLogSectionEmitter::IterationLogSectionEmitter (tcu::TestLog& log, size_t testIteration, size_t testIterations, const std::string& description, bool enabled)
	: m_log		(log)
	, m_enabled	(enabled)
{
	if (m_enabled)
	{
		std::ostringstream buf;
		buf << "Iteration " << (testIteration+1) << "/" << testIterations;

		if (!description.empty())
			buf << " - " << description;

		m_log << tcu::TestLog::Section(buf.str(), buf.str());
	}
}